

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FileOptions::SerializeWithCachedSizesToArray(FileOptions *this,uint8 *target)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  UninterpretedOption *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  uint32 uVar5;
  long lVar6;
  uint8 *puVar7;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->java_package_->_M_dataplus)._M_p,(int)this->java_package_->_M_string_length,
               SERIALIZE);
    psVar3 = this->java_package_;
    *target = '\n';
    uVar5 = (uint32)psVar3->_M_string_length;
    if (uVar5 < 0x80) {
      target[1] = (uint8)psVar3->_M_string_length;
      puVar7 = target + 2;
    }
    else {
      puVar7 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,puVar7);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->java_outer_classname_->_M_dataplus)._M_p,
               (int)this->java_outer_classname_->_M_string_length,SERIALIZE);
    psVar3 = this->java_outer_classname_;
    *target = 'B';
    uVar5 = (uint32)psVar3->_M_string_length;
    if (uVar5 < 0x80) {
      target[1] = (uint8)psVar3->_M_string_length;
      puVar7 = target + 2;
    }
    else {
      puVar7 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,puVar7);
  }
  if ((this->_has_bits_[0] & 0x10) != 0) {
    uVar2 = this->optimize_for_;
    *target = 'H';
    if ((long)(int)uVar2 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar2,target + 1);
    }
    else if (uVar2 < 0x80) {
      target[1] = (uint8)uVar2;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar2,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    bVar1 = this->java_multiple_files_;
    *target = 'P';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((this->_has_bits_[0] & 0x20) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->go_package_->_M_dataplus)._M_p,(int)this->go_package_->_M_string_length,
               SERIALIZE);
    psVar3 = this->go_package_;
    *target = 'Z';
    uVar5 = (uint32)psVar3->_M_string_length;
    if (uVar5 < 0x80) {
      target[1] = (uint8)psVar3->_M_string_length;
      puVar7 = target + 2;
    }
    else {
      puVar7 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,puVar7);
  }
  if ((this->_has_bits_[0] & 0x40) != 0) {
    bVar1 = this->cc_generic_services_;
    target[0] = 0x80;
    target[1] = '\x01';
    target[2] = bVar1;
    target = target + 3;
  }
  if ((this->_has_bits_[0] & 0x80) != 0) {
    bVar1 = this->java_generic_services_;
    target[0] = 0x88;
    target[1] = '\x01';
    target[2] = bVar1;
    target = target + 3;
  }
  if ((this->_has_bits_[0] & 0x100) != 0) {
    bVar1 = this->py_generic_services_;
    target[0] = 0x90;
    target[1] = '\x01';
    target[2] = bVar1;
    target = target + 3;
  }
  if ((this->_has_bits_[0] & 8) != 0) {
    bVar1 = this->java_generate_equals_and_hash_;
    target[0] = 0xa0;
    target[1] = '\x01';
    target[2] = bVar1;
    target = target + 3;
  }
  if (0 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      this_00 = (UninterpretedOption *)
                (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar6];
      target[0] = 0xba;
      target[1] = '>';
      uVar2 = this_00->_cached_size_;
      if (uVar2 < 0x80) {
        target[2] = (uint8)uVar2;
        puVar7 = target + 3;
      }
      else {
        puVar7 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar2,target + 2);
      }
      target = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar7);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  puVar7 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target);
  pvVar4 = (this->_unknown_fields_).fields_;
  if ((pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar7 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,puVar7);
    return puVar7;
  }
  return puVar7;
}

Assistant:

::google::protobuf::uint8* FileOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string java_package = 1;
  if (has_java_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_package().data(), this->java_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->java_package(), target);
  }

  // optional string java_outer_classname = 8;
  if (has_java_outer_classname()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_outer_classname().data(), this->java_outer_classname().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->java_outer_classname(), target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (has_optimize_for()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      9, this->optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (has_java_multiple_files()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if (has_go_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->go_package().data(), this->go_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        11, this->go_package(), target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (has_cc_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (has_java_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (has_py_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(18, this->py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [default = false];
  if (has_java_generate_equals_and_hash()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(20, this->java_generate_equals_and_hash(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}